

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O0

size_t varint_get_length(uint64_t v)

{
  uint64_t v_local;
  
  if (v < 0xfd) {
    v_local = 1;
  }
  else if (v < 0x10000) {
    v_local = 3;
  }
  else if (v < 0x100000000) {
    v_local = 5;
  }
  else {
    v_local = 9;
  }
  return v_local;
}

Assistant:

size_t varint_get_length(uint64_t v)
{
    if (v <= VI_MAX_8)
        return sizeof(uint8_t);
    if (v <= VI_MAX_16)
        return sizeof(uint8_t) + sizeof(uint16_t);
    if (v <= VI_MAX_32)
        return sizeof(uint8_t) + sizeof(uint32_t);
    return sizeof(uint8_t) + sizeof(uint64_t);
}